

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_nextInputSizeHint(ZSTD_CCtx *cctx)

{
  ZSTD_CCtx *local_20;
  size_t hintInSize;
  ZSTD_CCtx *cctx_local;
  
  if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
    cctx_local = (ZSTD_CCtx *)(cctx->blockSize - cctx->stableIn_notConsumed);
  }
  else {
    if ((cctx->appliedParams).inBufferMode != ZSTD_bm_buffered) {
      __assert_fail("cctx->appliedParams.inBufferMode == ZSTD_bm_buffered",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x16dd,"size_t ZSTD_nextInputSizeHint(const ZSTD_CCtx *)");
    }
    local_20 = (ZSTD_CCtx *)(cctx->inBuffTarget - cctx->inBuffPos);
    if (local_20 == (ZSTD_CCtx *)0x0) {
      local_20 = (ZSTD_CCtx *)cctx->blockSize;
    }
    cctx_local = local_20;
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_nextInputSizeHint(const ZSTD_CCtx* cctx)
{
    if (cctx->appliedParams.inBufferMode == ZSTD_bm_stable) {
        return cctx->blockSize - cctx->stableIn_notConsumed;
    }
    assert(cctx->appliedParams.inBufferMode == ZSTD_bm_buffered);
    {   size_t hintInSize = cctx->inBuffTarget - cctx->inBuffPos;
        if (hintInSize==0) hintInSize = cctx->blockSize;
        return hintInSize;
    }
}